

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void getRGB(Image *image,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool isSwitch)

{
  uint8_t uVar1;
  int iVar2;
  Image *pIVar3;
  uchar *__src;
  size_type sVar4;
  const_reference pvVar5;
  byte in_DL;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  int *in_RDI;
  int i;
  uint8_t *start;
  int scanline;
  Image *image_00;
  int local_24;
  
  iVar2 = *in_RDI;
  local_24 = iVar2 * 4;
  pIVar3 = (Image *)std::vector<Color,_std::allocator<Color>_>::data
                              ((vector<Color,_std::allocator<Color>_> *)0x108ee4);
  image_00 = pIVar3;
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108efd);
  memcpy(image_00,__src,(long)local_24);
  while( true ) {
    sVar4 = std::vector<Color,_std::allocator<Color>_>::size
                      ((vector<Color,_std::allocator<Color>_> *)(in_RDI + 2));
    if (sVar4 << 2 <= (ulong)(long)local_24) break;
    uVar1 = *(uint8_t *)((long)&(pIVar3->size).width + (long)(local_24 + iVar2 * -4));
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (in_RSI,(long)local_24);
    *(uint8_t *)((long)&(pIVar3->size).width + (long)local_24) = uVar1 + *pvVar5;
    local_24 = local_24 + 1;
  }
  if ((in_DL & 1) == 0) {
    swapBR(image_00);
  }
  return;
}

Assistant:

void getRGB(Image &image, const std::vector<uint8_t> &data, bool isSwitch) {
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(start, data.data(), scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		start[i] = start[i - scanline] + data[i];
	}
	if (!isSwitch) { swapBR(image); }
}